

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O3

void __thiscall re2::PrefilterTree::PrintDebugInfo(PrefilterTree *this,NodeMap *nodes)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_node_base *p_Var5;
  int *piVar6;
  pointer pEVar7;
  ulong local_1c8;
  LogMessage local_1b0;
  
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
             ,0x161);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0.str_,"#Unique Atoms: ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1b0.str_);
  LogMessage::~LogMessage(&local_1b0);
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
             ,0x162);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0.str_,"#Unique Nodes: ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1b0.str_);
  LogMessage::~LogMessage(&local_1b0);
  pEVar7 = (this->entries_).
           super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->entries_).
      super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish != pEVar7) {
    local_1c8 = 0;
    do {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
                 ,0x167);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0.str_,"EntryId: ",9);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1b0.str_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," N: ",4);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," R: ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      LogMessage::~LogMessage(&local_1b0);
      piVar2 = pEVar7[local_1c8].parents.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar6 = pEVar7[local_1c8].parents.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar6 != piVar2; piVar6 = piVar6 + 1) {
        iVar1 = *piVar6;
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
                   ,0x16a);
        std::ostream::operator<<(&local_1b0.str_,iVar1);
        LogMessage::~LogMessage(&local_1b0);
      }
      local_1c8 = local_1c8 + 1;
      pEVar7 = (this->entries_).
               super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (local_1c8 <
             (ulong)(((long)(this->entries_).
                            super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar7 >> 3) *
                    0x6db6db6db6db6db7));
  }
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
             ,0x16c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0.str_,"Map:",4);
  LogMessage::~LogMessage(&local_1b0);
  p_Var5 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(nodes->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var4) {
    do {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
                 ,0x16f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0.str_,"NodeId: ",8);
      poVar3 = (ostream *)
               std::ostream::operator<<(&local_1b0.str_,*(int *)(*(long *)(p_Var5 + 2) + 0x30));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," Str: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
      LogMessage::~LogMessage(&local_1b0);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var4);
  }
  return;
}

Assistant:

void PrefilterTree::PrintDebugInfo(NodeMap* nodes) {
  LOG(ERROR) << "#Unique Atoms: " << atom_index_to_id_.size();
  LOG(ERROR) << "#Unique Nodes: " << entries_.size();

  for (size_t i = 0; i < entries_.size(); i++) {
    const std::vector<int>& parents = entries_[i].parents;
    const std::vector<int>& regexps = entries_[i].regexps;
    LOG(ERROR) << "EntryId: " << i
               << " N: " << parents.size() << " R: " << regexps.size();
    for (int parent : parents)
      LOG(ERROR) << parent;
  }
  LOG(ERROR) << "Map:";
  for (NodeMap::const_iterator iter = nodes->begin();
       iter != nodes->end(); ++iter)
    LOG(ERROR) << "NodeId: " << (*iter).second->unique_id()
               << " Str: " << (*iter).first;
}